

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O0

CharacterSet __thiscall ZXing::Content::guessEncoding(Content *this)

{
  anon_class_16_2_f1cc56cb func;
  bool bVar1;
  uchar *bytes;
  size_type length;
  Content *in_RDI;
  ByteArray input;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  Content *in_stack_ffffffffffffffc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  CharacterSet local_1;
  
  ByteArray::ByteArray((ByteArray *)0x220d92);
  func.this = in_RDI;
  func.input = (ByteArray *)&local_28;
  ForEachECIBlock<ZXing::Content::guessEncoding()const::__0>(in_stack_ffffffffffffffc0,func);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  if (bVar1) {
    local_1 = Unknown;
  }
  else {
    bytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x220dff);
    length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_28);
    local_1 = TextDecoder::GuessEncoding(bytes,length,ISO8859_1);
  }
  ByteArray::~ByteArray((ByteArray *)0x220e40);
  return local_1;
}

Assistant:

CharacterSet Content::guessEncoding() const
{
	// assemble all blocks with unknown encoding
	ByteArray input;
	ForEachECIBlock([&](ECI eci, int begin, int end) {
		if (eci == ECI::Unknown)
			input.insert(input.end(), bytes.begin() + begin, bytes.begin() + end);
	});

	if (input.empty())
		return CharacterSet::Unknown;

	return TextDecoder::GuessEncoding(input.data(), input.size(), CharacterSet::ISO8859_1);
}